

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O0

void __thiscall amrex::MLABecLaplacian::update_singular_flags(MLABecLaplacian *this)

{
  bool bVar1;
  int __x;
  iterator pvVar2;
  LinOpBCType *pLVar3;
  iterator __last;
  LinOpBCType *pLVar4;
  int *piVar5;
  uint *puVar7;
  LinOpBCType *in_RDI;
  Real RVar8;
  double extraout_XMM0_Qa;
  Real amax;
  Real asum;
  int alev;
  LinOpBCType *ithi;
  LinOpBCType *itlo;
  bool in_stack_000000d3;
  int in_stack_000000d4;
  MultiFab *in_stack_000000d8;
  undefined1 in_stack_000002ae;
  undefined1 in_stack_000002af;
  int in_stack_000002b0;
  int in_stack_000002b4;
  MultiFab *in_stack_000002b8;
  size_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  LinOpBCType *in_stack_ffffffffffffffa8;
  size_type in_stack_ffffffffffffffb8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffc0;
  int local_30;
  reference pvVar6;
  
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x155539f);
  std::vector<int,_std::allocator<int>_>::resize
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(value_type *)in_RDI);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  pvVar2 = std::array<amrex::LinOpBCType,_3UL>::begin((array<amrex::LinOpBCType,_3UL> *)0x15553e1);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x1555403);
  pLVar3 = std::find<amrex::LinOpBCType*,amrex::LinOpBCType>
                     (in_RDI,in_stack_ffffffffffffffa8,pvVar2);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  __last = std::array<amrex::LinOpBCType,_3UL>::begin((array<amrex::LinOpBCType,_3UL> *)0x155543f);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x1555461);
  pLVar4 = std::find<amrex::LinOpBCType*,amrex::LinOpBCType>(in_RDI,__last,pvVar2);
  Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
  ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
  pvVar2 = std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x15554a7);
  if (pLVar3 == pvVar2) {
    Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
    ::operator[]((Vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                 in_stack_ffffffffffffff88);
    pvVar2 = std::array<amrex::LinOpBCType,_3UL>::end((array<amrex::LinOpBCType,_3UL> *)0x15554df);
    if (pLVar4 == pvVar2) {
      for (local_30 = 0; local_30 < (int)in_RDI[0xd]; local_30 = local_30 + 1) {
        piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            in_stack_ffffffffffffff88);
        if (*piVar5 != 0) {
          Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
          ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
          Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
          ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
          bVar1 = std::unique_ptr::operator_cast_to_bool
                            ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *
                             )0x1555553);
          if (!bVar1) {
            if ((*(double *)(in_RDI + 0xca) != 0.0) || (NAN(*(double *)(in_RDI + 0xca)))) {
              Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
              ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
              std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::back
                        ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
              MultiFab::sum(in_stack_000000d8,in_stack_000000d4,in_stack_000000d3);
              Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
              ::operator[]((Vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                            *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                           in_stack_ffffffffffffff88);
              pvVar6 = std::vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>::back
                                 ((vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_> *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
              __x = (int)pvVar6;
              RVar8 = MultiFab::norm0(in_stack_000002b8,in_stack_000002b4,in_stack_000002b0,
                                      (bool)in_stack_000002af,(bool)in_stack_000002ae);
              std::abs(__x);
              bVar1 = extraout_XMM0_Qa <= RVar8 * 1e-12;
              in_stack_ffffffffffffff94 = (uint)bVar1;
              puVar7 = (uint *)Vector<int,_std::allocator<int>_>::operator[]
                                         ((Vector<int,_std::allocator<int>_> *)
                                          (ulong)CONCAT14(bVar1,in_stack_ffffffffffffff90),
                                          in_stack_ffffffffffffff88);
              *puVar7 = in_stack_ffffffffffffff94;
            }
            else {
              piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                                 ((Vector<int,_std::allocator<int>_> *)
                                  CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                                  in_stack_ffffffffffffff88);
              *piVar5 = 1;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::update_singular_flags ()
{
    m_is_singular.clear();
    m_is_singular.resize(m_num_amr_levels, false);
    auto itlo = std::find(m_lobc[0].begin(), m_lobc[0].end(), BCType::Dirichlet);
    auto ithi = std::find(m_hibc[0].begin(), m_hibc[0].end(), BCType::Dirichlet);
    if (itlo == m_lobc[0].end() && ithi == m_hibc[0].end())
    {  // No Dirichlet
        for (int alev = 0; alev < m_num_amr_levels; ++alev)
        {
            // For now this assumes that overset regions are treated as Dirichlet bc's
            if (m_domain_covered[alev] && !m_overset_mask[alev][0])
            {
                if (m_a_scalar == 0.0)
                {
                    m_is_singular[alev] = true;
                }
                else
                {
                    Real asum = m_a_coeffs[alev].back().sum();
                    Real amax = m_a_coeffs[alev].back().norm0();
                    m_is_singular[alev] = (std::abs(asum) <= amax * 1.e-12);
                }
            }
        }
    }
}